

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVodeGetB(void *cvode_mem,int which,sunrealtype *tret,N_Vector yB)

{
  undefined8 in_RCX;
  sunrealtype *in_RDX;
  int in_ESI;
  CVodeMem in_RDI;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMemRec *local_40;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x671,"CVodeGetB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x679,"CVodeGetB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->cv_adj_mem->ca_nbckpbs) {
    for (local_40 = in_RDI->cv_adj_mem->cvB_mem;
        (local_40 != (CVodeBMemRec *)0x0 && (in_ESI != local_40->cv_index));
        local_40 = local_40->cv_next) {
    }
    N_VScale(0x3ff0000000000000,local_40->cv_y,in_RCX);
    *in_RDX = local_40->cv_tout;
    local_4 = 0;
  }
  else {
    cvProcessError(in_RDI,-0x16,0x682,"CVodeGetB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                   ,"Illegal value for which.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeGetB(void* cvode_mem, int which, sunrealtype* tret, N_Vector yB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }

  ca_mem = cv_mem->cv_adj_mem;

  /* Check the value of which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  N_VScale(ONE, cvB_mem->cv_y, yB);
  *tret = cvB_mem->cv_tout;

  return (CV_SUCCESS);
}